

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O3

void __thiscall
TCLAP::CmdLineParseException::CmdLineParseException
          (CmdLineParseException *this,string *text,string *id)

{
  ulong *puVar1;
  size_type *psVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong *local_118;
  long local_110;
  ulong local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  ArgException *local_d8;
  string local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_d8 = &this->super_ArgException;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Exception found when the values ","");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"on the command line do not meet ","");
  uVar4 = 0xf;
  if (local_50 != local_40) {
    uVar4 = local_40[0];
  }
  if (uVar4 < (ulong)(local_68 + local_48)) {
    uVar4 = 0xf;
    if (local_70 != local_60) {
      uVar4 = local_60[0];
    }
    if (uVar4 < (ulong)(local_68 + local_48)) goto LAB_0012515a;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_0012515a:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
  }
  local_118 = &local_108;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_108 = *puVar1;
    uStack_100 = *(undefined4 *)(puVar3 + 3);
    uStack_fc = *(undefined4 *)((long)puVar3 + 0x1c);
  }
  else {
    local_108 = *puVar1;
    local_118 = (ulong *)*puVar3;
  }
  local_110 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"the requirements of the defined ","");
  uVar4 = 0xf;
  if (local_118 != &local_108) {
    uVar4 = local_108;
  }
  if (uVar4 < (ulong)(local_a8 + local_110)) {
    uVar4 = 0xf;
    if (local_b0 != local_a0) {
      uVar4 = local_a0[0];
    }
    if (uVar4 < (ulong)(local_a8 + local_110)) goto LAB_00125224;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_118);
  }
  else {
LAB_00125224:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b0);
  }
  local_f8 = &local_e8;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_e8 = *puVar1;
    uStack_e0 = *(undefined4 *)(puVar3 + 3);
    uStack_dc = *(undefined4 *)((long)puVar3 + 0x1c);
  }
  else {
    local_e8 = *puVar1;
    local_f8 = (ulong *)*puVar3;
  }
  local_f0 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Args.","");
  uVar4 = 0xf;
  if (local_f8 != &local_e8) {
    uVar4 = local_e8;
  }
  if (uVar4 < (ulong)(local_88 + local_f0)) {
    uVar4 = 0xf;
    if (local_90 != local_80) {
      uVar4 = local_80[0];
    }
    if ((ulong)(local_88 + local_f0) <= uVar4) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_f8);
      goto LAB_00125313;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_90);
LAB_00125313:
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar2 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_d0.field_2._M_allocated_capacity = *psVar2;
    local_d0.field_2._8_8_ = puVar3[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar2;
    local_d0._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_d0._M_string_length = puVar3[1];
  *puVar3 = psVar2;
  puVar3[1] = 0;
  *(undefined1 *)psVar2 = 0;
  ArgException::ArgException(local_d8,text,id,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  *(undefined ***)local_d8 = &PTR__ArgException_0013a990;
  return;
}

Assistant:

CmdLineParseException( const std::string& text = "undefined exception", 
					           const std::string& id = "undefined" )
			: ArgException( text, 
			                id,
							std::string( "Exception found when the values ") +
							std::string( "on the command line do not meet ") +
							std::string( "the requirements of the defined ") +
							std::string( "Args." ))
		{ }